

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BufferParamVerifiers::GetBufferParameterI64Verifier::verifyInteger
          (GetBufferParameterI64Verifier *this,TestContext *testCtx,GLenum target,GLenum name,
          GLint reference)

{
  bool bVar1;
  qpTestResult qVar2;
  long *plVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1c0;
  undefined1 local_40 [8];
  StateQueryMemoryWriteGuard<long> state;
  GLint reference_local;
  GLenum name_local;
  GLenum target_local;
  TestContext *testCtx_local;
  GetBufferParameterI64Verifier *this_local;
  
  state.m_postguard._4_4_ = reference;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)local_40);
  plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                     ((StateQueryMemoryWriteGuard<long> *)local_40);
  glu::CallLogWrapper::glGetBufferParameteri64v
            (&(this->super_BufferParamVerifier).super_CallLogWrapper,target,name,plVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)local_40,testCtx);
  if ((bVar1) &&
     (plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                         ((StateQueryMemoryWriteGuard *)local_40),
     *plVar3 != (long)state.m_postguard._4_4_)) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [20])"// ERROR: expected ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&state.m_postguard + 4));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b8b5f6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<long> *)local_40);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid value");
    }
  }
  return;
}

Assistant:

void GetBufferParameterI64Verifier::verifyInteger (tcu::TestContext& testCtx, GLenum target, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetBufferParameteri64v(target, name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}